

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void rgb2hsv(QRgb rgb,int *h,int *s,int *v)

{
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_FS_OFFSET;
  QColor c;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QColor::QColor((QColor *)0x736a60);
  QColor::setRgb((uint)&local_18);
  QColor::getHsv((int *)&local_18,in_RSI,in_RDX,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void rgb2hsv(QRgb rgb, int &h, int &s, int &v)
{
    QColor c;
    c.setRgb(rgb);
    c.getHsv(&h, &s, &v);
}